

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.h
# Opt level: O1

string * __thiscall
puppup::movegen::toString_abi_cxx11_(string *__return_storage_ptr__,movegen *this,long *mov)

{
  long lVar1;
  ostream *poVar2;
  const_iterator __begin2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  long *plVar6;
  long lVar7;
  long *plVar8;
  long lVar9;
  bool bVar10;
  Rack tmp1;
  stringstream ss;
  Rack tmp2;
  long local_3b8 [32];
  stringstream local_2b8 [16];
  ostream local_2a8 [112];
  ios_base local_238 [264];
  long alStack_130 [32];
  
  std::__cxx11::stringstream::stringstream(local_2b8);
  lVar1 = 0;
  do {
    *(undefined8 *)((long)local_3b8 + lVar1) = 999;
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x100);
  lVar1 = 0;
  do {
    *(undefined8 *)((long)alStack_130 + lVar1) = 999;
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x100);
  lVar1 = *(long *)(this + 8);
  if (lVar1 != -1) {
    plVar3 = *(long **)(*mov + lVar1 * 0x18);
    plVar6 = *(long **)(*mov + 8 + lVar1 * 0x18);
    if (plVar3 != plVar6) {
      lVar4 = *(long *)(this + 0x18);
      plVar8 = (long *)((long)&tmp1 +
                       *(long *)(this + 0x10) * 8 +
                       ((ulong)((long)plVar6 - (long)plVar3) >> 3) * lVar4 * -8);
      do {
        if (*plVar8 == 0x1b) {
          lVar9 = *plVar3;
          *plVar8 = lVar9;
          plVar8[0x100] = (&scores)[lVar9];
          local_3b8[lVar9] = local_3b8[lVar9] + -1;
        }
        plVar3 = plVar3 + 1;
        plVar8 = plVar8 + lVar4;
      } while (plVar3 != plVar6);
    }
    uVar5 = *(ulong *)(this + 0x20);
    if (uVar5 != 0) {
      do {
        *(undefined8 *)(&stack0x00000808 + (uVar5 & 0xffff) * 8) = 0;
        local_3b8[0x1a] = local_3b8[0x1a] + -1;
        local_3b8[tmp1._M_elems[(uVar5 & 0xffff) - 1]] =
             local_3b8[tmp1._M_elems[(uVar5 & 0xffff) - 1]] + 1;
        bVar10 = 0xffff < uVar5;
        uVar5 = (long)uVar5 >> 0x10;
      } while (bVar10);
    }
    lVar4 = 0;
    do {
      if (local_3b8[lVar4] < 0) {
        alStack_130[lVar4] = alStack_130[lVar4] + local_3b8[lVar4];
        local_3b8[lVar4] = 0;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x20);
  }
  lVar4 = *mov;
  lVar7 = *(long *)(this + 0x10) -
          (*(long *)(lVar4 + 8 + lVar1 * 0x18) - *(long *)(lVar4 + lVar1 * 0x18) >> 3) *
          *(long *)(this + 0x18);
  lVar9 = lVar7 + 0xf;
  if (-1 < lVar7) {
    lVar9 = lVar7;
  }
  if (*(long *)(this + 0x18) == 0x10) {
    poVar2 = std::ostream::_M_insert<long>((long)local_2a8);
    local_3b8[0]._0_1_ = "ABCDEFGHIJKLMNOPQRSTUVWXYZ"[lVar9 >> 4];
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_3b8,1);
  }
  else {
    local_3b8[0]._0_1_ = "ABCDEFGHIJKLMNOPQRSTUVWXYZ"[lVar9 >> 4];
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_2a8,(char *)local_3b8,1);
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  plVar3 = (long *)(lVar4 + lVar1 * 0x18);
  plVar6 = (long *)*plVar3;
  plVar3 = (long *)plVar3[1];
  if (plVar6 != plVar3) {
    do {
      if (*(long *)(&stack0x00000810 + lVar7 * 8) == 0) {
        local_3b8[0]._0_1_ = "EIAONTRSULDGYWVPMHFCBZXQKJ_    +"[*plVar6];
        std::__ostream_insert<char,std::char_traits<char>>(local_2a8,(char *)local_3b8,1);
      }
      else {
        local_3b8[0]._0_1_ = "eiaontrsuldgywvpmhfcbzxqkj_    +"[*plVar6];
        std::__ostream_insert<char,std::char_traits<char>>(local_2a8,(char *)local_3b8,1);
      }
      lVar7 = lVar7 + *(long *)(this + 0x18);
      plVar6 = plVar6 + 1;
    } while (plVar6 != plVar3);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_2b8);
  std::ios_base::~ios_base(local_238);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString(const Move& mov, board::State state,
                            const trie::Gaddag& gaddag) {
    std::stringstream ss;
    makeMove(state, mov, gaddag);
    const auto& s = gaddag.getStringFromWord(mov.word);
    idx cursor = mov.cursor - s.size() * mov.step;
    idx x = cursor % 16 - board::board_min;
    idx y = cursor / 16 - board::board_min;
    if (mov.step == 16) {
        ss << x + 1 << ABC[y] << " ";
    } else {
        ss << ABC[y] << x + 1 << " ";
    }

    for (chr c : s) {
        if (state.letter_score[cursor] == 0) {
            ss << idxSTR[c];
        } else {
            ss << idxstr[c];
        }
        cursor += mov.step;
    }
    return ss.str();
}